

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

bool __thiscall booster::log::logger::should_be_logged(logger *this,level_type level,char *module)

{
  char *__s1;
  int iVar1;
  level_type lVar2;
  level_type *plVar3;
  
  lVar2 = this->default_level_;
  do {
    plVar3 = &this->entries_[0].level;
    __s1 = this->entries_[0].module;
    if (__s1 == (char *)0x0) goto LAB_0017b00d;
    iVar1 = strcmp(__s1,module);
    this = (logger *)plVar3;
  } while (iVar1 != 0);
  lVar2 = *plVar3;
LAB_0017b00d:
  return (int)level <= (int)lVar2;
}

Assistant:

bool logger::should_be_logged(level_type level,char const *module)
	{
		level_type module_level = default_level_;
		for(entry *p=entries_;p->module;p++) {
			if(strcmp(p->module,module)==0) {
				module_level=p->level;
				break;
			}
		}
		return level <= module_level;
	}